

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.h
# Opt level: O3

void __thiscall despot::util::tinyxml::TiXmlText::TiXmlText(TiXmlText *this,char *initValue)

{
  size_t len;
  
  (this->super_TiXmlNode).super_TiXmlBase.location.row = -1;
  (this->super_TiXmlNode).super_TiXmlBase.location.col = -1;
  (this->super_TiXmlNode).super_TiXmlBase.userData = (void *)0x0;
  (this->super_TiXmlNode).parent = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).value.rep_ = (Rep *)&TiXmlString::nullrep_;
  (this->super_TiXmlNode).type = TEXT;
  (this->super_TiXmlNode).firstChild = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).lastChild = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).prev = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).next = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase = (_func_int **)&PTR__TiXmlNode_001906f8;
  len = strlen(initValue);
  TiXmlString::assign(&(this->super_TiXmlNode).value,initValue,len);
  this->cdata = false;
  return;
}

Assistant:

TiXmlText(const char * initValue) :
		TiXmlNode(TiXmlNode::TEXT) {
		SetValue(initValue);
		cdata = false;
	}